

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_infer_vectors(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,
                      h262_macroblock *mb,int s)

{
  uint ival;
  int iVar1;
  int bottom;
  int s_local;
  h262_macroblock *mb_local;
  h262_picparm *picparm_local;
  h262_seqparm *seqparm_local;
  bitstream *str_local;
  
  if (picparm->picture_structure != 3) {
    ival = (uint)(picparm->picture_structure == 2);
    iVar1 = vs_infer(str,mb->motion_vertical_field_select[s],ival);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(str,mb->motion_vertical_field_select[s] + 1,ival);
    if (iVar1 != 0) {
      return 1;
    }
  }
  iVar1 = vs_infer(str,mb->motion_code[0][s],0);
  if (iVar1 == 0) {
    iVar1 = vs_infer(str,mb->motion_code[0][s] + 1,0);
    if (iVar1 == 0) {
      iVar1 = vs_infer(str,mb->motion_code[1][s],0);
      if (iVar1 == 0) {
        iVar1 = vs_infer(str,mb->motion_residual[-1][s] + 1,0);
        if (iVar1 == 0) {
          iVar1 = vs_infer(str,mb->motion_residual[0][s],0);
          if (iVar1 == 0) {
            iVar1 = vs_infer(str,mb->motion_residual[0][s] + 1,0);
            if (iVar1 == 0) {
              iVar1 = vs_infer(str,mb->motion_residual[1][s],0);
              if (iVar1 == 0) {
                iVar1 = vs_infer(str,mb->dmvector + (long)s * 2 + -3,0);
                if (iVar1 == 0) {
                  if (s == 0) {
                    iVar1 = vs_infer(str,mb->dmvector,0);
                    if (iVar1 != 0) {
                      return 1;
                    }
                    iVar1 = vs_infer(str,mb->dmvector + 1,0);
                    if (iVar1 != 0) {
                      return 1;
                    }
                  }
                  str_local._4_4_ = 0;
                }
                else {
                  str_local._4_4_ = 1;
                }
              }
              else {
                str_local._4_4_ = 1;
              }
            }
            else {
              str_local._4_4_ = 1;
            }
          }
          else {
            str_local._4_4_ = 1;
          }
        }
        else {
          str_local._4_4_ = 1;
        }
      }
      else {
        str_local._4_4_ = 1;
      }
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  else {
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

int h262_infer_vectors(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int s) {
	if (picparm->picture_structure != H262_PIC_STRUCT_FRAME) {
		int bottom = picparm->picture_structure == H262_PIC_STRUCT_FIELD_BOTTOM;
		if (vs_infer(str, &mb->motion_vertical_field_select[s][0], bottom)) return 1;
		if (vs_infer(str, &mb->motion_vertical_field_select[s][1], bottom)) return 1;
	}
	if (vs_infer(str, &mb->motion_code[0][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_code[0][s][1], 0)) return 1;
	if (vs_infer(str, &mb->motion_code[1][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_code[1][s][1], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[0][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[0][s][1], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[1][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[1][s][1], 0)) return 1;
	if (!s) {
		if (vs_infer(str, &mb->dmvector[0], 0)) return 1;
		if (vs_infer(str, &mb->dmvector[1], 0)) return 1;
	}
	return 0;
}